

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_window.c
# Opt level: O3

char * getSelectionString(Atom selection)

{
  long lVar1;
  int iVar2;
  Window WVar3;
  Atom *pAVar4;
  char *pcVar5;
  char *pcVar6;
  undefined8 uVar7;
  long lVar8;
  size_t size;
  bool bVar9;
  char *data;
  unsigned_long itemCount;
  uint local_1f0;
  int actualFormat;
  long local_1e8;
  Atom local_1e0;
  Atom local_1d8;
  Atom actualType;
  Atom local_1c8;
  unsigned_long bytesAfter;
  Atom local_1b8;
  XEvent notification;
  XEvent dummy;
  
  local_1c8 = _glfw.x11.UTF8_STRING;
  local_1b8 = 0x1f;
  bVar9 = _glfw.x11.PRIMARY != selection;
  WVar3 = (*_glfw.x11.xlib.GetSelectionOwner)(_glfw.x11.display,selection);
  pcVar5 = *(char **)((long)_glfw.x11.keynames + (ulong)bVar9 * 8 + -0x10);
  if (WVar3 != _glfw.x11.helperWindowHandle) {
    lVar1 = (ulong)bVar9 * 8;
    lVar8 = lVar1 + 0x20a48;
    _glfw_free(pcVar5);
    *(undefined8 *)((long)_glfw.x11.keynames + lVar1 + -0x10) = 0;
    pAVar4 = &local_1c8;
    uVar7 = CONCAT71((int7)(WVar3 >> 8),1);
    local_1e8 = lVar8;
    local_1e0 = selection;
    do {
      local_1f0 = (uint)uVar7;
      local_1d8 = *pAVar4;
      (*_glfw.x11.xlib.ConvertSelection)
                (_glfw.x11.display,selection,local_1d8,_glfw.x11.GLFW_SELECTION,
                 _glfw.x11.helperWindowHandle,0);
      while (iVar2 = (*_glfw.x11.xlib.CheckTypedWindowEvent)
                               (_glfw.x11.display,_glfw.x11.helperWindowHandle,0x1f,&notification),
            iVar2 == 0) {
        waitForEvent((double *)0x0);
      }
      if (notification.xkey.time != 0) {
        (*_glfw.x11.xlib.CheckIfEvent)
                  (_glfw.x11.display,&dummy,isSelPropNewValueNotify,(XPointer)&notification);
        (*_glfw.x11.xlib.GetWindowProperty)
                  (_glfw.x11.display,notification.xany.window,notification.xkey.time,0,
                   0x7fffffffffffffff,1,0,&actualType,&actualFormat,&itemCount,&bytesAfter,
                   (uchar **)&data);
        if (actualType == _glfw.x11.INCR) {
          size = 1;
          pcVar5 = (char *)0x0;
          do {
            while (iVar2 = (*_glfw.x11.xlib.CheckIfEvent)
                                     (_glfw.x11.display,&dummy,isSelPropNewValueNotify,
                                      (XPointer)&notification), iVar2 == 0) {
              waitForEvent((double *)0x0);
            }
            (*_glfw.x11.xlib.Free)(data);
            (*_glfw.x11.xlib.GetWindowProperty)
                      (_glfw.x11.display,notification.xany.window,notification.xkey.time,0,
                       0x7fffffffffffffff,1,0,&actualType,&actualFormat,&itemCount,&bytesAfter,
                       (uchar **)&data);
            if (itemCount == 0) break;
            size = size + itemCount;
            pcVar5 = (char *)_glfw_realloc(pcVar5,size);
            pcVar5[~itemCount + size] = '\0';
            strcat(pcVar5,data);
          } while (itemCount != 0);
          if (local_1d8 == 0x1f) {
            pcVar6 = convertLatin1toUTF8(pcVar5);
            lVar8 = local_1e8;
            *(char **)((long)&_glfw.initialized + local_1e8) = pcVar6;
            _glfw_free(pcVar5);
            selection = local_1e0;
          }
          else {
            *(char **)((long)&_glfw.initialized + local_1e8) = pcVar5;
            lVar8 = local_1e8;
            selection = local_1e0;
          }
        }
        else if (actualType == local_1d8) {
          if (local_1d8 == 0x1f) {
            pcVar5 = convertLatin1toUTF8(data);
          }
          else {
            pcVar5 = _glfw_strdup(data);
          }
          *(char **)((long)&_glfw.initialized + lVar8) = pcVar5;
        }
        (*_glfw.x11.xlib.Free)(data);
        pcVar5 = *(char **)((long)&_glfw.initialized + lVar8);
        if (pcVar5 != (char *)0x0) {
          return pcVar5;
        }
      }
      pAVar4 = &local_1b8;
      uVar7 = 0;
    } while ((local_1f0 & 1) != 0);
    pcVar5 = *(char **)((long)&_glfw.initialized + lVar8);
    if (pcVar5 == (char *)0x0) {
      _glfwInputError(0x10009,"X11: Failed to convert selection to string");
      pcVar5 = *(char **)((long)&_glfw.initialized + lVar8);
    }
  }
  return pcVar5;
}

Assistant:

static const char* getSelectionString(Atom selection)
{
    char** selectionString = NULL;
    const Atom targets[] = { _glfw.x11.UTF8_STRING, XA_STRING };
    const size_t targetCount = sizeof(targets) / sizeof(targets[0]);

    if (selection == _glfw.x11.PRIMARY)
        selectionString = &_glfw.x11.primarySelectionString;
    else
        selectionString = &_glfw.x11.clipboardString;

    if (XGetSelectionOwner(_glfw.x11.display, selection) ==
        _glfw.x11.helperWindowHandle)
    {
        // Instead of doing a large number of X round-trips just to put this
        // string into a window property and then read it back, just return it
        return *selectionString;
    }

    _glfw_free(*selectionString);
    *selectionString = NULL;

    for (size_t i = 0;  i < targetCount;  i++)
    {
        char* data;
        Atom actualType;
        int actualFormat;
        unsigned long itemCount, bytesAfter;
        XEvent notification, dummy;

        XConvertSelection(_glfw.x11.display,
                          selection,
                          targets[i],
                          _glfw.x11.GLFW_SELECTION,
                          _glfw.x11.helperWindowHandle,
                          CurrentTime);

        while (!XCheckTypedWindowEvent(_glfw.x11.display,
                                       _glfw.x11.helperWindowHandle,
                                       SelectionNotify,
                                       &notification))
        {
            waitForEvent(NULL);
        }

        if (notification.xselection.property == None)
            continue;

        XCheckIfEvent(_glfw.x11.display,
                      &dummy,
                      isSelPropNewValueNotify,
                      (XPointer) &notification);

        XGetWindowProperty(_glfw.x11.display,
                           notification.xselection.requestor,
                           notification.xselection.property,
                           0,
                           LONG_MAX,
                           True,
                           AnyPropertyType,
                           &actualType,
                           &actualFormat,
                           &itemCount,
                           &bytesAfter,
                           (unsigned char**) &data);

        if (actualType == _glfw.x11.INCR)
        {
            size_t size = 1;
            char* string = NULL;

            for (;;)
            {
                while (!XCheckIfEvent(_glfw.x11.display,
                                      &dummy,
                                      isSelPropNewValueNotify,
                                      (XPointer) &notification))
                {
                    waitForEvent(NULL);
                }

                XFree(data);
                XGetWindowProperty(_glfw.x11.display,
                                   notification.xselection.requestor,
                                   notification.xselection.property,
                                   0,
                                   LONG_MAX,
                                   True,
                                   AnyPropertyType,
                                   &actualType,
                                   &actualFormat,
                                   &itemCount,
                                   &bytesAfter,
                                   (unsigned char**) &data);

                if (itemCount)
                {
                    size += itemCount;
                    string = _glfw_realloc(string, size);
                    string[size - itemCount - 1] = '\0';
                    strcat(string, data);
                }

                if (!itemCount)
                {
                    if (targets[i] == XA_STRING)
                    {
                        *selectionString = convertLatin1toUTF8(string);
                        _glfw_free(string);
                    }
                    else
                        *selectionString = string;

                    break;
                }
            }
        }
        else if (actualType == targets[i])
        {
            if (targets[i] == XA_STRING)
                *selectionString = convertLatin1toUTF8(data);
            else
                *selectionString = _glfw_strdup(data);
        }

        XFree(data);

        if (*selectionString)
            break;
    }

    if (!*selectionString)
    {
        _glfwInputError(GLFW_FORMAT_UNAVAILABLE,
                        "X11: Failed to convert selection to string");
    }

    return *selectionString;
}